

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_path.c
# Opt level: O0

void test_archive_match_path(void)

{
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                      ,L'Ʋ',"exclusion",L'ƶ',L'\xffffffff',"second\nfour\n");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                      ,L'Ƴ',"exclusion_null",L'ƶ',L'\f',"second");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                      ,L'Ƶ',"inclusion",L'ƶ',L'\xffffffff',"first\nthird\n");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                      ,L'ƶ',"inclusion_null",L'ƶ',L'\f',"first");
  test_exclusion_mbs();
  test_exclusion_wcs();
  test_exclusion_from_file_mbs();
  test_exclusion_from_file_wcs();
  test_inclusion_mbs();
  test_inclusion_wcs();
  test_inclusion_from_file_mbs();
  test_inclusion_from_file_wcs();
  test_exclusion_and_inclusion();
  return;
}

Assistant:

DEFINE_TEST(test_archive_match_path)
{
	/* Make exclusion sample files which contain exclusion patterns. */
	assertMakeFile("exclusion", 0666, "second\nfour\n");
	assertMakeBinFile("exclusion_null", 0666, 12, "second\0four\0");
	/* Make inclusion sample files which contain inclusion patterns. */
	assertMakeFile("inclusion", 0666, "first\nthird\n");
	assertMakeBinFile("inclusion_null", 0666, 12, "first\0third\0");

	test_exclusion_mbs();
	test_exclusion_wcs();
	test_exclusion_from_file_mbs();
	test_exclusion_from_file_wcs();
	test_inclusion_mbs();
	test_inclusion_wcs();
	test_inclusion_from_file_mbs();
	test_inclusion_from_file_wcs();
	test_exclusion_and_inclusion();
}